

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isonumber.c
# Opt level: O0

char * isonumber_from_s64(isonumber_str *out,int64_t number,char *unit,uint64_t scaling,_Bool raw)

{
  char *pcVar1;
  size_t local_50;
  size_t len;
  uint64_t num;
  char *outbuf;
  _Bool raw_local;
  uint64_t scaling_local;
  char *unit_local;
  int64_t number_local;
  isonumber_str *out_local;
  
  local_50 = 0x30;
  if (number == -0x8000000000000000) {
    num = (uint64_t)(out->buf + 1);
    out->buf[0] = '-';
    local_50 = 0x2f;
    len = 0x8000000000000000;
  }
  else {
    len = number;
    num = (uint64_t)out;
    if (number < 0) {
      num = (uint64_t)(out->buf + 1);
      out->buf[0] = '-';
      local_50 = 0x2f;
      len = -number;
    }
  }
  pcVar1 = _isonumber_u64_to_string((char *)num,local_50,len,unit,scaling,raw);
  out_local = out;
  if (pcVar1 == (char *)0x0) {
    out_local = (isonumber_str *)0x0;
  }
  return out_local->buf;
}

Assistant:

const char *
isonumber_from_s64(struct isonumber_str *out, int64_t number, const char *unit, uint64_t scaling, bool raw) {
  char *outbuf = out->buf;
  uint64_t num;
  size_t len;

  len = sizeof(*out);
  if (number == INT64_MIN) {
    *outbuf++ = '-';
    len--;
    num = 1ull << 63;
  }
  else if (number < 0) {
    *outbuf++ = '-';
    len--;
    num = (uint64_t)(-number);
  }
  else {
    num = (uint64_t)number;
  }

  if (_isonumber_u64_to_string(outbuf, len, num, unit, scaling, raw)) {
    return out->buf;
  }
  return NULL;
}